

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QRingChunk>::eraseLast(QGenericArrayOps<QRingChunk> *this)

{
  QArrayDataPointer<QRingChunk> *in_RDI;
  
  QArrayDataPointer<QRingChunk>::end(in_RDI);
  QRingChunk::~QRingChunk((QRingChunk *)0x20e818);
  in_RDI->size = in_RDI->size + -1;
  return;
}

Assistant:

void eraseLast() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        (this->end() - 1)->~T();
        --this->size;
    }